

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_yuv_rgb.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint y_stride_00;
  uint uv_stride_00;
  uint rgb_stride_00;
  long lVar2;
  long lVar3;
  ulong local_218;
  size_t uv_size_2;
  size_t y_size_2;
  uint i_2;
  size_t rgba_stride;
  size_t uv_stride_2;
  size_t y_stride_2;
  uint8_t *RGBA;
  size_t uv_size_1;
  size_t y_size_1;
  ulong uStack_1c0;
  uint i_1;
  size_t rgb_stride_1;
  size_t uv_stride_1;
  size_t y_stride_1;
  long lStack_1a0;
  uint i;
  size_t uv_size;
  size_t y_size;
  size_t rgb_stride;
  size_t uv_stride;
  size_t y_stride;
  uint8_t *Va;
  uint8_t *Ua;
  uint8_t *Ya;
  uint8_t *YUVa;
  uint8_t *RGBa;
  uint8_t *V;
  uint8_t *U;
  uint8_t *Y;
  uint8_t *RGB;
  uint8_t *YUV;
  char *out;
  uint32_t height;
  uint32_t width;
  char *filename;
  undefined4 local_108;
  Mode mode;
  YCbCrType yuv_format;
  int iteration_number;
  char **argv_local;
  int argc_local;
  undefined8 local_e8;
  size_t local_e0;
  uint8_t *local_d8;
  uint8_t *local_d0;
  undefined8 local_c8;
  size_t local_c0;
  uint8_t *local_b8;
  uint8_t *local_b0;
  undefined8 local_a8;
  size_t local_a0;
  uint8_t *local_98;
  uint8_t *local_90;
  undefined8 local_88;
  size_t local_80;
  uint8_t *local_78;
  uint8_t *local_70;
  undefined8 local_68;
  size_t local_60;
  uint8_t *local_58;
  uint8_t *local_50;
  undefined8 local_48;
  size_t local_40;
  uint8_t *local_38;
  uint8_t *local_30;
  uint8_t *local_28;
  
  argv_local._4_4_ = 0;
  _yuv_format = argv;
  argv_local._0_4_ = argc;
  if (argc < 4) {
    printf(
          "Usage : test yuv2rgb <yuv image file> <image width> <image height> <output template filename>\n"
          );
    printf(
          "Or    : test yuv2rgb_nv12 <yuv image file> <image width> <image height> <output template filename>\n"
          );
    printf(
          "Or    : test yuv2rgb_nv21 <yuv image file> <image width> <image height> <output template filename>\n"
          );
    printf("Or    : test rgb2yuv <rgb24 binary ppm image file> <output template filename>\n");
    printf("Or    : test rgba2yuv <rgb24 binary ppm image file> <output template filename>\n");
    argv_local._4_4_ = 1;
  }
  else {
    mode = 100;
    printf("Time will be measured in each configuration for %d iterations...\n",100);
    local_108 = 1;
    iVar1 = strcmp(_yuv_format[1],"yuv2rgb");
    if (iVar1 == 0) {
      filename._4_4_ = 1;
      if ((int)argv_local < 6) {
        printf("Invalid argument number for yuv2rgb mode, call without argument to see usage.\n");
        return 1;
      }
    }
    else {
      iVar1 = strcmp(_yuv_format[1],"yuv2rgb_nv12");
      if (iVar1 == 0) {
        filename._4_4_ = 2;
      }
      else {
        iVar1 = strcmp(_yuv_format[1],"yuv2rgb_nv21");
        if (iVar1 == 0) {
          filename._4_4_ = 3;
        }
        else {
          iVar1 = strcmp(_yuv_format[1],"rgb2yuv");
          if (iVar1 == 0) {
            filename._4_4_ = 0;
          }
          else {
            iVar1 = strcmp(_yuv_format[1],"rgba2yuv");
            if (iVar1 != 0) {
              printf("Invalid mode, call without argument to see usage.\n");
              return 1;
            }
            filename._4_4_ = 4;
          }
        }
      }
    }
    _height = _yuv_format[2];
    RGB = (uint8_t *)0x0;
    Y = (uint8_t *)0x0;
    U = (uint8_t *)0x0;
    V = (uint8_t *)0x0;
    RGBa = (uint8_t *)0x0;
    YUVa = (uint8_t *)0x0;
    Ya = (uint8_t *)0x0;
    Ua = (uint8_t *)0x0;
    Va = (uint8_t *)0x0;
    y_stride = 0;
    if (((filename._4_4_ == 1) || (filename._4_4_ == 2)) || (filename._4_4_ == 3)) {
      out._4_4_ = atoi(_yuv_format[3]);
      out._0_4_ = atoi(_yuv_format[4]);
      YUV = (uint8_t *)_yuv_format[5];
      iVar1 = readRawYUV(_height,out._4_4_,(uint32_t)out,&RGB);
      if (iVar1 != 0) {
        printf(
              "Error reading image file, check that the file exists and has the correct format and resolution.\n"
              );
        return 1;
      }
      Y = (uint8_t *)malloc((ulong)(out._4_4_ * 3 * (uint32_t)out));
      U = RGB;
      V = RGB + out._4_4_ * (uint32_t)out;
      RGBa = RGB + (ulong)((out._4_4_ + 1 >> 1) * ((uint32_t)out + 1 >> 1)) +
                   (ulong)(out._4_4_ * (uint32_t)out);
      uv_stride = (size_t)(out._4_4_ + (0x10 - (out._4_4_ & 0xf) & 0xf));
      local_218 = uv_stride;
      if (filename._4_4_ == 1) {
        local_218 = (ulong)((out._4_4_ + 1 >> 1) + (0x10 - (out._4_4_ + 1 >> 1 & 0xf) & 0xf));
      }
      rgb_stride = local_218;
      y_size = (size_t)(out._4_4_ * 3 + (0x10 - (out._4_4_ * 3 & 0xf) & 0xf));
      uv_size = uv_stride * (uint32_t)out;
      lStack_1a0 = local_218 * ((uint32_t)out + 1 >> 1);
      local_40 = uv_size + lStack_1a0 * 2;
      local_48 = 0x10;
      iVar1 = posix_memalign(&local_50,0x10,local_40);
      if (iVar1 == 0) {
        local_38 = local_50;
      }
      else {
        local_38 = (uint8_t *)0x0;
      }
      Ya = local_38;
      Ua = local_38;
      Va = local_38 + uv_size;
      y_stride = (size_t)(local_38 + lStack_1a0 + uv_size);
      for (y_stride_1._4_4_ = 0; y_stride_1._4_4_ < (uint32_t)out;
          y_stride_1._4_4_ = y_stride_1._4_4_ + 1) {
        memcpy(Ua + y_stride_1._4_4_ * uv_stride,U + y_stride_1._4_4_ * out._4_4_,(ulong)out._4_4_);
        if ((y_stride_1._4_4_ & 1) == 0) {
          if (filename._4_4_ == 1) {
            memcpy(Va + (y_stride_1._4_4_ >> 1) * rgb_stride,
                   V + (y_stride_1._4_4_ >> 1) * (out._4_4_ + 1 >> 1),(ulong)(out._4_4_ + 1 >> 1));
            memcpy((void *)(y_stride + (y_stride_1._4_4_ >> 1) * rgb_stride),
                   RGBa + (y_stride_1._4_4_ >> 1) * (out._4_4_ + 1 >> 1),(ulong)(out._4_4_ + 1 >> 1)
                  );
          }
          else {
            memcpy(Va + (y_stride_1._4_4_ >> 1) * rgb_stride,V + (y_stride_1._4_4_ >> 1) * out._4_4_
                   ,(ulong)out._4_4_);
          }
        }
      }
      local_60 = y_size * (uint32_t)out;
      local_68 = 0x10;
      iVar1 = posix_memalign(&local_70,0x10,local_60);
      if (iVar1 == 0) {
        local_58 = local_70;
      }
      else {
        local_58 = (uint8_t *)0x0;
      }
      YUVa = local_58;
      if (filename._4_4_ == 1) {
        test_yuv2rgb(out._4_4_,(uint32_t)out,U,V,RGBa,out._4_4_,out._4_4_ + 1 >> 1,Y,out._4_4_ * 3,
                     YCBCR_601,(char *)YUV,"std",100,yuv420_rgb24_std);
        test_yuv2rgb(out._4_4_,(uint32_t)out,U,V,RGBa,out._4_4_,out._4_4_ + 1 >> 1,Y,out._4_4_ * 3,
                     YCBCR_601,(char *)YUV,"sse2_unaligned",100,yuv420_rgb24_sseu);
        test_yuv2rgb(out._4_4_,(uint32_t)out,Ua,Va,(uint8_t *)y_stride,(uint32_t)uv_stride,
                     (uint32_t)rgb_stride,YUVa,(uint32_t)y_size,YCBCR_601,(char *)YUV,"sse2_aligned"
                     ,100,yuv420_rgb24_sse);
      }
      else if (filename._4_4_ == 2) {
        test_yuvsp2rgb(out._4_4_,(uint32_t)out,U,V,out._4_4_,out._4_4_,Y,out._4_4_ * 3,YCBCR_601,
                       (char *)YUV,"std",100,nv12_rgb24_std);
        test_yuvsp2rgb(out._4_4_,(uint32_t)out,U,V,out._4_4_,out._4_4_,Y,out._4_4_ * 3,YCBCR_601,
                       (char *)YUV,"sse2_unaligned",100,nv12_rgb24_sseu);
        test_yuvsp2rgb(out._4_4_,(uint32_t)out,Ua,Va,(uint32_t)uv_stride,(uint32_t)rgb_stride,YUVa,
                       (uint32_t)y_size,YCBCR_601,(char *)YUV,"sse2_aligned",100,nv12_rgb24_sse);
      }
      else if (filename._4_4_ == 3) {
        test_yuvsp2rgb(out._4_4_,(uint32_t)out,U,V,out._4_4_,out._4_4_,Y,out._4_4_ * 3,YCBCR_601,
                       (char *)YUV,"std",100,nv21_rgb24_std);
        test_yuvsp2rgb(out._4_4_,(uint32_t)out,U,V,out._4_4_,out._4_4_,Y,out._4_4_ * 3,YCBCR_601,
                       (char *)YUV,"sse2_unaligned",100,nv21_rgb24_sseu);
        test_yuvsp2rgb(out._4_4_,(uint32_t)out,Ua,Va,(uint32_t)uv_stride,(uint32_t)rgb_stride,YUVa,
                       (uint32_t)y_size,YCBCR_601,(char *)YUV,"sse2_aligned",100,nv21_rgb24_sse);
      }
    }
    else if (filename._4_4_ == 0) {
      YUV = (uint8_t *)_yuv_format[3];
      iVar1 = readPPM(_height,(uint32_t *)((long)&out + 4),(uint32_t *)&out,&Y);
      if (iVar1 != 0) {
        printf("Error reading image file, check that the file exists and has the correct format.\n")
        ;
        return 1;
      }
      U = (uint8_t *)malloc((ulong)(out._4_4_ * (uint32_t)out * 3 >> 1));
      V = U + out._4_4_ * (uint32_t)out;
      RGBa = U + (ulong)((out._4_4_ + 1 >> 1) * ((uint32_t)out + 1 >> 1)) +
                 (ulong)(out._4_4_ * (uint32_t)out);
      uv_stride_1 = (size_t)(out._4_4_ + (0x10 - (out._4_4_ & 0xf) & 0xf));
      rgb_stride_1 = (size_t)((out._4_4_ + 1 >> 1) + (0x10 - (out._4_4_ + 1 >> 1 & 0xf) & 0xf));
      uStack_1c0 = (ulong)(out._4_4_ * 3 + (0x10 - (out._4_4_ * 3 & 0xf) & 0xf));
      local_80 = uStack_1c0 * (uint32_t)out;
      local_88 = 0x10;
      RGB = U;
      iVar1 = posix_memalign(&local_90,0x10,local_80);
      if (iVar1 == 0) {
        local_78 = local_90;
      }
      else {
        local_78 = (uint8_t *)0x0;
      }
      YUVa = local_78;
      for (y_size_1._4_4_ = 0; y_size_1._4_4_ < (uint32_t)out; y_size_1._4_4_ = y_size_1._4_4_ + 1)
      {
        memcpy(YUVa + y_size_1._4_4_ * uStack_1c0,Y + y_size_1._4_4_ * out._4_4_ * 3,
               (ulong)(out._4_4_ * 3));
      }
      uv_size_1 = uv_stride_1 * (uint32_t)out;
      RGBA = (uint8_t *)(rgb_stride_1 * ((uint32_t)out + 1 >> 1));
      local_a0 = uv_size_1 + (long)RGBA * 2;
      local_a8 = 0x10;
      iVar1 = posix_memalign(&local_b0,0x10,local_a0);
      if (iVar1 == 0) {
        local_98 = local_b0;
      }
      else {
        local_98 = (uint8_t *)0x0;
      }
      Ya = local_98;
      Ua = local_98;
      Va = local_98 + uv_size_1;
      y_stride = (size_t)(local_98 + uv_size_1 + (long)RGBA);
      test_rgb2yuv(out._4_4_,(uint32_t)out,Y,out._4_4_ * 3,U,V,RGBa,out._4_4_,out._4_4_ + 1 >> 1,
                   YCBCR_601,(char *)YUV,"std",100,rgb24_yuv420_std);
      test_rgb2yuv(out._4_4_,(uint32_t)out,Y,out._4_4_ * 3,U,V,RGBa,out._4_4_,out._4_4_ + 1 >> 1,
                   YCBCR_601,(char *)YUV,"sse2_unaligned",100,rgb24_yuv420_sseu);
      test_rgb2yuv(out._4_4_,(uint32_t)out,YUVa,(uint32_t)uStack_1c0,Ua,Va,(uint8_t *)y_stride,
                   (uint32_t)uv_stride_1,(uint32_t)rgb_stride_1,YCBCR_601,(char *)YUV,"sse2_aligned"
                   ,100,rgb24_yuv420_sse);
    }
    else if (filename._4_4_ == 4) {
      YUV = (uint8_t *)_yuv_format[3];
      iVar1 = readPPM(_height,(uint32_t *)((long)&out + 4),(uint32_t *)&out,&Y);
      if (iVar1 != 0) {
        printf("Error reading image file, check that the file exists and has the correct format.\n")
        ;
        return 1;
      }
      y_stride_2 = 0;
      convert_rgb_to_rgba(Y,out._4_4_,(uint32_t)out,(uint8_t **)&y_stride_2);
      U = (uint8_t *)malloc((ulong)(out._4_4_ * (uint32_t)out * 3 >> 1));
      V = U + out._4_4_ * (uint32_t)out;
      RGBa = U + (ulong)((out._4_4_ + 1 >> 1) * ((uint32_t)out + 1 >> 1)) +
                 (ulong)(out._4_4_ * (uint32_t)out);
      y_stride_00 = out._4_4_ + (0x10 - (out._4_4_ & 0xf) & 0xf);
      uv_stride_00 = (out._4_4_ + 1 >> 1) + (0x10 - (out._4_4_ + 1 >> 1 & 0xf) & 0xf);
      rgb_stride_00 = out._4_4_ * 4 + ((out._4_4_ & 3) * -4 + 0x10 & 0xf);
      local_c0 = (ulong)rgb_stride_00 * (ulong)(uint32_t)out;
      local_c8 = 0x10;
      RGB = U;
      iVar1 = posix_memalign(&local_d0,0x10,local_c0);
      if (iVar1 == 0) {
        local_b8 = local_d0;
      }
      else {
        local_b8 = (uint8_t *)0x0;
      }
      YUVa = local_b8;
      for (y_size_2._4_4_ = 0; y_size_2._4_4_ < (uint32_t)out; y_size_2._4_4_ = y_size_2._4_4_ + 1)
      {
        memcpy(YUVa + (ulong)y_size_2._4_4_ * (ulong)rgb_stride_00,
               (void *)(y_stride_2 + y_size_2._4_4_ * out._4_4_ * 4),(ulong)(out._4_4_ << 2));
      }
      lVar2 = (ulong)y_stride_00 * (ulong)(uint32_t)out;
      lVar3 = (ulong)uv_stride_00 * (ulong)((uint32_t)out + 1 >> 1);
      local_e0 = lVar2 + lVar3 * 2;
      local_e8 = 0x10;
      iVar1 = posix_memalign((void **)&argc_local,0x10,local_e0);
      if (iVar1 == 0) {
        local_d8 = _argc_local;
      }
      else {
        local_d8 = (uint8_t *)0x0;
      }
      Ya = local_d8;
      Ua = local_d8;
      Va = local_d8 + lVar2;
      y_stride = (size_t)(local_d8 + lVar3 + lVar2);
      test_rgb2yuv(out._4_4_,(uint32_t)out,(uint8_t *)y_stride_2,out._4_4_ << 2,U,V,RGBa,out._4_4_,
                   out._4_4_ + 1 >> 1,YCBCR_601,(char *)YUV,"std",100,rgb32_yuv420_std);
      test_rgb2yuv(out._4_4_,(uint32_t)out,(uint8_t *)y_stride_2,out._4_4_ << 2,U,V,RGBa,out._4_4_,
                   out._4_4_ + 1 >> 1,YCBCR_601,(char *)YUV,"sse2_unaligned",100,rgb32_yuv420_sseu);
      test_rgb2yuv(out._4_4_,(uint32_t)out,YUVa,rgb_stride_00,Ua,Va,(uint8_t *)y_stride,y_stride_00,
                   uv_stride_00,YCBCR_601,(char *)YUV,"sse2_aligned",100,rgb32_yuv420_sse);
      free((void *)y_stride_2);
    }
    local_28 = YUVa;
    free(YUVa);
    local_30 = Ya;
    free(Ya);
    free(Y);
    free(RGB);
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
	if(argc<4)
	{
		printf("Usage : test yuv2rgb <yuv image file> <image width> <image height> <output template filename>\n");
		printf("Or    : test yuv2rgb_nv12 <yuv image file> <image width> <image height> <output template filename>\n");
		printf("Or    : test yuv2rgb_nv21 <yuv image file> <image width> <image height> <output template filename>\n");
		printf("Or    : test rgb2yuv <rgb24 binary ppm image file> <output template filename>\n");
		printf("Or    : test rgba2yuv <rgb24 binary ppm image file> <output template filename>\n");
		return 1;
	}
	
	const int iteration_number = 100;
	printf("Time will be measured in each configuration for %d iterations...\n", iteration_number);
	const YCbCrType yuv_format = YCBCR_601;
	//const YCbCrType yuv_format = YCBCR_709;
	//const YCbCrType yuv_format = YCBCR_JPEG;
	
	Mode mode;
	if(strcmp(argv[1], "yuv2rgb")==0)
	{
		mode=YUV2RGB;
		if(argc<6)
		{
			printf("Invalid argument number for yuv2rgb mode, call without argument to see usage.\n");
			return 1;
		}
	}
	else if(strcmp(argv[1], "yuv2rgb_nv12")==0)
	{
		mode=YUV2RGB_NV12;
	}
	else if(strcmp(argv[1], "yuv2rgb_nv21")==0)
	{
		mode=YUV2RGB_NV21;
	}
	else if(strcmp(argv[1], "rgb2yuv")==0)
	{
		mode=RGB2YUV;
	}
	else if(strcmp(argv[1], "rgba2yuv")==0)
	{
		mode=RGBA2YUV;
	}
	else
	{
		printf("Invalid mode, call without argument to see usage.\n");
		return 1;
	}
	
	const char *filename = argv[2];
	uint32_t width, height;
	const char *out;
	uint8_t *YUV=NULL, *RGB=NULL, *Y=NULL, *U=NULL, *V=NULL, *RGBa=NULL, *YUVa=NULL, *Ya=NULL, *Ua=NULL, *Va=NULL;
	
	if(mode==YUV2RGB || mode==YUV2RGB_NV12 ||  mode==YUV2RGB_NV21)
	{
		//parse argument line
		width = atoi(argv[3]);
		height = atoi(argv[4]);
		out = argv[5];
		
		// read input data and allocate output data
		if(readRawYUV(filename, width, height, &YUV)!=0)
		{
			printf("Error reading image file, check that the file exists and has the correct format and resolution.\n");
			return 1;
		}
		
#if USE_FFMPEG
		yuv2rgb_swscale_ctx = sws_getContext(width, height, AV_PIX_FMT_YUV420P, width, height, AV_PIX_FMT_RGB24, 0, 0, 0, 0);
#endif
		
		RGB = malloc(3*width*height);
		
		Y = YUV;
		U = YUV+width*height;
		V = YUV+width*height+((width+1)/2)*((height+1)/2);
		
		// allocate aligned data
		const size_t y_stride = width + (16-width%16)%16;
		const size_t uv_stride = (mode==YUV2RGB) ? (width+1)/2 + (16-((width+1)/2)%16)%16 : y_stride;
		const size_t rgb_stride = width*3 +(16-(3*width)%16)%16;
	
		const size_t y_size = y_stride*height, uv_size = uv_stride*((height+1)/2);
		YUVa = _mm_malloc(y_size+2*uv_size, 16);
		Ya = YUVa;
		Ua = YUVa+y_size;
		Va = YUVa+y_size+uv_size;
		for(unsigned int i=0; i<height; ++i)
		{
			memcpy(Ya+i*y_stride, Y+i*width, width);
			if((i%2)==0)
			{
				if(mode==YUV2RGB)
				{
					memcpy(Ua+(i/2)*uv_stride, U+(i/2)*((width+1)/2), (width+1)/2);
					memcpy(Va+(i/2)*uv_stride, V+(i/2)*((width+1)/2), (width+1)/2);
				}
				else
				{
					memcpy(Ua+(i/2)*uv_stride, U+(i/2)*width, width);
				}
			}
		}
		
		RGBa = _mm_malloc(rgb_stride*height, 16);
		
		// test all versions
		if(mode==YUV2RGB)
		{
			test_yuv2rgb(width, height, Y, U, V, width, (width+1)/2, RGB, width*3, yuv_format, 
				out, "std", iteration_number, yuv420_rgb24_std);
			test_yuv2rgb(width, height, Y, U, V, width, (width+1)/2, RGB, width*3, yuv_format, 
				out, "sse2_unaligned", iteration_number, yuv420_rgb24_sseu);
#if USE_FFMPEG
			test_yuv2rgb(width, height, Y, U, V, width, (width+1)/2, RGB, width*3, yuv_format, 
				out, "ffmpeg_unaligned", iteration_number, yuv420_rgb24_ffmpeg);
#endif
#if USE_IPP
			test_yuv2rgb(width, height, Y, U, V, width, (width+1)/2, RGB, width*3, yuv_format, 
				out, "ipp_unaligned", iteration_number, yuv420_rgb24_ipp);
#endif
			test_yuv2rgb(width, height, Ya, Ua, Va, y_stride, uv_stride, RGBa, rgb_stride, yuv_format, 
				out, "sse2_aligned", iteration_number, yuv420_rgb24_sse);
#if USE_FFMPEG
			test_yuv2rgb(width, height, Ya, Ua, Va, y_stride, uv_stride, RGBa, rgb_stride, yuv_format, 
				out, "ffmpeg_aligned", iteration_number, yuv420_rgb24_ffmpeg);
#endif
#if USE_IPP
			test_yuv2rgb(width, height, Ya, Ua, Va, y_stride, uv_stride, RGBa, rgb_stride, yuv_format, 
				out, "ipp_aligned", iteration_number, yuv420_rgb24_ipp);
#endif
		}
		else if(mode==YUV2RGB_NV12)
		{
			test_yuvsp2rgb(width, height, Y, U, width, width, RGB, width*3, yuv_format, 
				out, "std", iteration_number, nv12_rgb24_std);
			test_yuvsp2rgb(width, height, Y, U, width, width, RGB, width*3, yuv_format, 
				out, "sse2_unaligned", iteration_number, nv12_rgb24_sseu);
			test_yuvsp2rgb(width, height, Ya, Ua, y_stride, uv_stride, RGBa, rgb_stride, yuv_format, 
				out, "sse2_aligned", iteration_number, nv12_rgb24_sse);
		}
		else if(mode==YUV2RGB_NV21)
		{
			test_yuvsp2rgb(width, height, Y, U, width, width, RGB, width*3, yuv_format, 
				out, "std", iteration_number, nv21_rgb24_std);
			test_yuvsp2rgb(width, height, Y, U, width, width, RGB, width*3, yuv_format, 
				out, "sse2_unaligned", iteration_number, nv21_rgb24_sseu);
			test_yuvsp2rgb(width, height, Ya, Ua, y_stride, uv_stride, RGBa, rgb_stride, yuv_format, 
				out, "sse2_aligned", iteration_number, nv21_rgb24_sse);
		}
	}
	else if(mode==RGB2YUV)
	{
		//parse argument line
		out = argv[3];
		
		// read input data and allocate output data
		if(readPPM(filename, &width, &height, &RGB)!=0)
		{
			printf("Error reading image file, check that the file exists and has the correct format.\n");
			return 1;
		}
		
#if USE_FFMPEG
		rgb2yuv_swscale_ctx = sws_getContext(width, height, AV_PIX_FMT_RGB24, width, height, AV_PIX_FMT_YUV420P, 0, 0, 0, 0);
#endif
		
		YUV = malloc(width*height*3/2);
		
		Y = YUV;
		U = YUV+width*height;
		V = YUV+width*height+((width+1)/2)*((height+1)/2);
		
		// allocate aligned data
		const size_t y_stride = width + (16-width%16)%16,
		uv_stride = (width+1)/2 + (16-((width+1)/2)%16)%16,
		rgb_stride = width*3 +(16-(3*width)%16)%16;
		
		RGBa = _mm_malloc(rgb_stride*height, 16);
		for(unsigned int i=0; i<height; ++i)
		{
			memcpy(RGBa+i*rgb_stride, RGB+i*width*3, width*3);
		}
		
		const size_t y_size = y_stride*height, uv_size = uv_stride*((height+1)/2);
		YUVa = _mm_malloc(y_size+2*uv_size, 16);
		Ya = YUVa;
		Ua = YUVa+y_size;
		Va = YUVa+y_size+uv_size;

		
		// test all versions
		test_rgb2yuv(width, height, RGB, width*3, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "std", iteration_number, rgb24_yuv420_std);
		test_rgb2yuv(width, height, RGB, width*3, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "sse2_unaligned", iteration_number, rgb24_yuv420_sseu);
#if USE_FFMPEG
		test_rgb2yuv(width, height, RGB, width*3, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "ffmpeg_unaligned", iteration_number, rgb24_yuv420_ffmpeg);
#endif
#if USE_IPP
		test_rgb2yuv(width, height, RGB, width*3, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "ipp_unaligned", iteration_number, rgb24_yuv420_ipp);
#endif
		test_rgb2yuv(width, height, RGBa, rgb_stride, Ya, Ua, Va, y_stride, uv_stride, yuv_format, 
			out, "sse2_aligned", iteration_number, rgb24_yuv420_sse);
#if USE_FFMPEG
		test_rgb2yuv(width, height, RGBa, rgb_stride, Ya, Ua, Va, y_stride, uv_stride, yuv_format, 
			out, "ffmpeg_aligned", iteration_number, rgb24_yuv420_ffmpeg);
#endif
#if USE_IPP
		test_rgb2yuv(width, height, RGBa, rgb_stride, Ya, Ua, Va, y_stride, uv_stride, yuv_format, 
			out, "ipp_aligned", iteration_number, rgb24_yuv420_ipp);
#endif
	}
	else if(mode==RGBA2YUV)
	{
		//parse argument line
		out = argv[3];
		
		// read input data and allocate output data
		if(readPPM(filename, &width, &height, &RGB)!=0)
		{
			printf("Error reading image file, check that the file exists and has the correct format.\n");
			return 1;
		}
		// convert rgb to rgba
		uint8_t *RGBA = NULL;
		convert_rgb_to_rgba(RGB, width, height, &RGBA);
		
		YUV = malloc(width*height*3/2);
		
		Y = YUV;
		U = YUV+width*height;
		V = YUV+width*height+((width+1)/2)*((height+1)/2);
		
		// allocate aligned data
		const size_t y_stride = width + (16-width%16)%16,
		uv_stride = (width+1)/2 + (16-((width+1)/2)%16)%16,
		rgba_stride = width*4 +(16-(4*width)%16)%16;
		
		RGBa = _mm_malloc(rgba_stride*height, 16);
		for(unsigned int i=0; i<height; ++i)
		{
			memcpy(RGBa+i*rgba_stride, RGBA+i*width*4, width*4);
		}
		
		const size_t y_size = y_stride*height, uv_size = uv_stride*((height+1)/2);
		YUVa = _mm_malloc(y_size+2*uv_size, 16);
		Ya = YUVa;
		Ua = YUVa+y_size;
		Va = YUVa+y_size+uv_size;
		
		// test all versions
		test_rgb2yuv(width, height, RGBA, width*4, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "std", iteration_number, rgb32_yuv420_std);
		test_rgb2yuv(width, height, RGBA, width*4, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "sse2_unaligned", iteration_number, rgb32_yuv420_sseu);
		test_rgb2yuv(width, height, RGBa, rgba_stride, Ya, Ua, Va, y_stride, uv_stride, yuv_format, 
			out, "sse2_aligned", iteration_number, rgb32_yuv420_sse);
		
		free(RGBA);
	}
	
	_mm_free(RGBa);
	_mm_free(YUVa);
	free(RGB);
	free(YUV);
	
	return 0;
}